

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitBlock(CheckerVisitor *this,Block *b)

{
  size_t sVar1;
  CheckerVisitor *visitor;
  VarScope *this_00;
  VarScope *pVVar2;
  Block *in_RSI;
  VarScope *in_RDI;
  Statement *s;
  iterator __end1;
  iterator __begin1;
  ArenaVector<SQCompilation::Statement_*> *__range1;
  VarScope blockScope;
  VarScope *thisScope;
  value_type *in_stack_ffffffffffffff28;
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  *in_stack_ffffffffffffff30;
  VarScope *p;
  FunctionDecl *o;
  Block *in_stack_ffffffffffffff58;
  CheckerVisitor *in_stack_ffffffffffffff60;
  Block *in_stack_ffffffffffffff68;
  VarScope *pVVar3;
  CheckerVisitor *in_stack_ffffffffffffff70;
  CheckerVisitor *this_01;
  CheckerVisitor *in_stack_ffffffffffffff78;
  VarScope *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  CheckerVisitor *in_stack_ffffffffffffff90;
  int local_68;
  VarScope *local_58;
  Block *in_stack_ffffffffffffffb8;
  __node_base in_stack_ffffffffffffffc0;
  
  checkForgottenDo(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  checkUnreachableCode(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  checkAssignedTwice((CheckerVisitor *)in_stack_ffffffffffffffc0._M_nxt,in_stack_ffffffffffffffb8);
  checkFunctionSimilarity
            (in_stack_ffffffffffffff90,
             (Block *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  checkAssignExpressionSimilarity(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  sVar1 = (in_RDI->symbols)._M_h._M_rehash_policy._M_next_resize;
  if (sVar1 == 0) {
    o = (FunctionDecl *)0x0;
  }
  else {
    o = *(FunctionDecl **)(sVar1 + 8);
  }
  p = (VarScope *)&local_68;
  VarScope::VarScope(in_RDI,o,p);
  (in_RDI->symbols)._M_h._M_rehash_policy._M_next_resize = (size_t)p;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  visitor = (CheckerVisitor *)Block::statements(in_RSI);
  this_01 = visitor;
  this_00 = (VarScope *)
            ArenaVector<SQCompilation::Statement_*>::begin
                      ((ArenaVector<SQCompilation::Statement_*> *)visitor);
  pVVar3 = this_00;
  pVVar2 = (VarScope *)
           ArenaVector<SQCompilation::Statement_*>::end
                     ((ArenaVector<SQCompilation::Statement_*> *)this_01);
  for (; pVVar3 != pVVar2; pVVar3 = (VarScope *)&pVVar3->owner) {
    Node::visit<SQCompilation::CheckerVisitor>((Node *)p,visitor);
    local_68 = local_68 + 1;
  }
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::pop_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)0x191b9f);
  local_58 = (VarScope *)0x0;
  VarScope::checkUnusedSymbols(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  (in_RDI->symbols)._M_h._M_rehash_policy._M_next_resize = sVar1;
  VarScope::~VarScope(this_00);
  return;
}

Assistant:

void CheckerVisitor::visitBlock(Block *b) {
  checkForgottenDo(b);
  checkUnreachableCode(b);
  checkAssignedTwice(b);
  checkFunctionSimilarity(b);
  checkAssignExpressionSimilarity(b);

  VarScope *thisScope = currentScope;
  VarScope blockScope(thisScope ? thisScope->owner : nullptr, thisScope);
  currentScope = &blockScope;

  nodeStack.push_back({ SST_NODE, b });

  for (Statement *s : b->statements()) {
    s->visit(this);
    blockScope.evalId += 1;
  }

  nodeStack.pop_back();

  blockScope.parent = nullptr;
  blockScope.checkUnusedSymbols(this);
  currentScope = thisScope;
}